

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O2

void __thiscall
NodeParser::parseEmitter
          (NodeParser *this,Node *node,Network *nw,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  Pattern *pPVar5;
  InputError *pIVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_80;
  double local_60;
  double coeff;
  double local_38;
  double expon;
  
  if (0x20 < (ulong)((long)(tokens->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(tokens->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    iVar4 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar4 == 0) {
      local_60 = 0.0;
      local_38 = (nw->options).valueOptions[6];
      pbVar1 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = Utilities::parseNumber<double>(pbVar1 + 1,&local_60);
      if (!bVar3) {
        pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&coeff,(string *)(pbVar1 + 1));
        InputError::InputError(pIVar6,6,(string *)&coeff);
        __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
      }
      iVar4 = (int)((ulong)((long)pbVar2 - (long)pbVar1) >> 5);
      if (2 < iVar4) {
        bVar3 = Utilities::parseNumber<double>(pbVar1 + 2,&local_38);
        if (!bVar3) {
          pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&coeff,(string *)(pbVar1 + 2));
          InputError::InputError(pIVar6,6,(string *)&coeff);
          __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
        }
        if (iVar4 != 3) {
          __lhs = pbVar1 + 3;
          bVar3 = std::operator!=(__lhs,"*");
          if (bVar3) {
            pPVar5 = Network::pattern(nw,__lhs);
            if (pPVar5 == (Pattern *)0x0) {
              pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string((string *)&coeff,(string *)__lhs);
              InputError::InputError(pIVar6,5,(string *)&coeff);
              __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
            }
          }
        }
      }
      bVar3 = Emitter::addEmitter((Junction *)node,local_60,local_38,(Pattern *)0x0);
      if (!bVar3) {
        pIVar6 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_80,"Node Emitter",(allocator *)&coeff);
        InputError::InputError(pIVar6,1,&local_80);
        __cxa_throw(pIVar6,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
  }
  return;
}

Assistant:

void NodeParser::parseEmitter(Node* node, Network* nw, vector<string>& tokens)
{
    // ... cast Node to Junction
    if ( tokens.size() < 2 ) return;
    if ( node->type() != Node::JUNCTION ) return;
    Junction* junc = static_cast<Junction*>(node);

    // ... read emitter's parameters
    double coeff = 0.0;
    double expon = nw->option(Options::EMITTER_EXPONENT);
    Pattern* pattern = 0;
    parseEmitterData(nw, tokens, coeff, expon, pattern);

    // ... add an emitter to the junction
    if ( !Emitter::addEmitter(junc, coeff, expon, pattern) )
    {
        throw InputError(InputError::CANNOT_CREATE_OBJECT, "Node Emitter");
    }
}